

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O3

void pzshape::TPZShapePrism::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int iVar8;
  double *pdVar9;
  long *plVar10;
  long lVar11;
  bool bVar12;
  int transformation_index;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int64_t size;
  long lVar16;
  int xj_2;
  uint uVar17;
  long lVar18;
  long lVar19;
  TPZVec<double> *pt_00;
  int xj;
  long lVar20;
  int (*paiVar21) [4];
  long lVar22;
  ulong uVar23;
  int iVar24;
  long lVar25;
  TPZVec<long> ids;
  TPZManVector<double,_1> outvalvec;
  TPZFNMatrix<100,_double> phiblend;
  REAL store2 [60];
  TPZFNMatrix<100,_double> dphiblend;
  REAL store1 [20];
  long local_ec8;
  long local_ec0;
  long local_e90;
  TPZVec<double> local_e50;
  TPZFMatrix<double> local_e30;
  TPZVec<long> *local_da0;
  TPZFMatrix<double> local_d98;
  _func_int **local_d08;
  TPZManVector<long,_10> local_d00;
  TPZFMatrix<double> local_c90;
  double local_c00 [101];
  TPZFMatrix<double> local_8d8;
  double local_848 [61];
  TPZFMatrix<double> local_660;
  double local_5d0 [101];
  TPZFMatrix<double> local_2a8;
  double local_218 [61];
  
  local_da0 = id;
  CornerShape(pt,phi,dphi);
  bVar12 = true;
  lVar15 = 0;
  do {
    bVar12 = (bool)(bVar12 & order->fStore[lVar15] < 2);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 0xf);
  if (!bVar12) {
    local_c90.fElem = local_c00;
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x15;
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_c90.fSize = 100;
    local_c90.fGiven = local_c90.fElem;
    TPZVec<int>::TPZVec(&local_c90.fPivot.super_TPZVec<int>,0);
    local_c90.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_c90.fPivot.super_TPZVec<int>.fStore = local_c90.fPivot.fExtAlloc;
    local_c90.fPivot.super_TPZVec<int>.fNElements = 0;
    local_c90.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_c90.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_c90.fWork.fStore = (double *)0x0;
    local_c90.fWork.fNElements = 0;
    local_c90.fWork.fNAlloc = 0;
    local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    local_660.fElem = local_5d0;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x15;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018379e0;
    local_660.fSize = 100;
    pt_00 = (TPZVec<double> *)&local_660.fPivot;
    local_660.fGiven = local_660.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pt_00,0);
    local_660.fPivot.super_TPZVec<int>.fStore = local_660.fPivot.fExtAlloc;
    local_660.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_660.fPivot.super_TPZVec<int>.fNElements = 0;
    local_660.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_660.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    local_660.fWork.fStore = (double *)0x0;
    local_660.fWork.fNElements = 0;
    local_660.fWork.fNAlloc = 0;
    local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_018376f0;
    lVar15 = 0;
    lVar22 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar22) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
         (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_c90.fElem[lVar22] = phi->fElem[lVar22];
      lVar18 = 0;
      do {
        lVar19 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
        if ((lVar19 <= lVar18) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar22)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
           (local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar22)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_660.fElem +
         lVar18 * 8 + local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar15) =
             *(undefined8 *)((long)dphi->fElem + lVar18 * 8 + lVar19 * lVar15);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      lVar22 = lVar22 + 1;
      lVar15 = lVar15 + 8;
    } while (lVar22 != 6);
    ShapeGenerating(pt_00,&local_c90,&local_660);
    local_ec0 = 6;
    local_e90 = 0x30;
    local_d08 = (_func_int **)&PTR__TPZManVector_018b7c18;
    lVar15 = 0;
    do {
      pdVar9 = pt->fStore;
      dVar1 = (double)(&gRibTrans3dPrisma1d)[lVar15 * 3];
      dVar2 = (double)(&DAT_01a30638)[lVar15 * 3];
      dVar3 = pdVar9[1];
      dVar4 = *pdVar9;
      dVar5 = (double)(&DAT_01a30640)[lVar15 * 3];
      dVar6 = pdVar9[2];
      dVar7 = (double)(&gRibSum3dPrisma1d)[lVar15];
      TPZVec<long>::TPZVec((TPZVec<long> *)&local_e50,2);
      TPZVec<double>::TPZVec((TPZVec<double> *)&local_d00,0);
      local_d00.super_TPZVec<long>._vptr_TPZVec = local_d08;
      local_d00.super_TPZVec<long>.fNElements = 1;
      local_d00.super_TPZVec<long>.fNAlloc = 0;
      iVar8 = pztopology::TPZPrism::SideNodes[lVar15][1];
      plVar10 = local_da0->fStore;
      *local_e50.fStore = (double)plVar10[pztopology::TPZPrism::SideNodes[lVar15][0]];
      local_e50.fStore[1] = (double)plVar10[iVar8];
      iVar24 = order->fStore[lVar15];
      iVar8 = iVar24 + -1;
      lVar22 = (long)iVar8;
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_d98.fElem = (double *)&local_2a8;
      local_d98.fSize = 0x14;
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar22;
      local_d98.fGiven = local_d98.fElem;
      local_d00.super_TPZVec<long>.fStore = local_d00.fExtAlloc;
      local_d00.fExtAlloc[0] = (long)(dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3 + dVar7);
      TPZVec<int>::TPZVec(&local_d98.fPivot.super_TPZVec<int>,0);
      local_d98.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_d98.fPivot.super_TPZVec<int>.fStore = local_d98.fPivot.fExtAlloc;
      local_d98.fPivot.super_TPZVec<int>.fNElements = 0;
      local_d98.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_d98.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_d98.fWork.fStore = (double *)0x0;
      local_d98.fWork.fNElements = 0;
      local_d98.fWork.fNAlloc = 0;
      if (iVar8 == 0) {
        local_d98.fElem = (double *)0x0;
      }
      else if (0x15 < iVar24) {
        local_d98.fElem = (double *)operator_new__(lVar22 * 8);
      }
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018151d8;
      local_e30.fElem = (double *)&local_8d8;
      local_e30.fSize = 0x3c;
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar22;
      local_e30.fGiven = local_e30.fElem;
      TPZVec<int>::TPZVec(&local_e30.fPivot.super_TPZVec<int>,0);
      local_e30.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_e30.fPivot.super_TPZVec<int>.fStore = local_e30.fPivot.fExtAlloc;
      local_e30.fPivot.super_TPZVec<int>.fNElements = 0;
      local_e30.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_e30.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_e30.fWork.fStore = (double *)0x0;
      local_e30.fWork.fNElements = 0;
      local_e30.fWork.fNAlloc = 0;
      if (iVar8 == 0) {
        local_e30.fElem = (double *)0x0;
      }
      else if (0x15 < iVar24) {
        local_e30.fElem = (double *)operator_new__(lVar22 * 0x18);
      }
      memset(local_d98.fElem,0,
             local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_e30.fElem,0,
             local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      iVar13 = order->fStore[lVar15];
      transformation_index = TPZShapeLinear::GetTransformId1d((TPZVec<long> *)&local_e50);
      TPZShapeLinear::ShapeInternal
                ((TPZVec<double> *)&local_d00,iVar13,&local_d98,&local_e30,transformation_index);
      TransformDerivativeFromRibToPrisma((int)lVar15,iVar8,&local_e30);
      if (1 < iVar24) {
        lVar18 = lVar15 + 6;
        local_ec0 = (long)(int)local_ec0;
        lVar19 = local_ec0 * 8;
        lVar16 = 0;
        lVar25 = 0;
        do {
          if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
             (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar25) ||
             (local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_ec0 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ec0)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_ec0] =
               local_c90.fElem[lVar15 + 6] *
               *(double *)
                ((long)(&((TPZFMatrix<double> *)
                         (&((TPZFMatrix<double> *)
                           ((TPZManVector<int,_5> *)((long)local_d98.fElem + 0x38) + -1))->fPivot +
                         -1))->fPivot + 0xffffffffffffffff) + lVar25 * 8);
          lVar20 = 0;
          do {
            if ((local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar18)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar25) ||
               (local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar18) ||
               (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar20) ||
               (local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar25)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar11 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar11 <= lVar20) || (local_ec0 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ec0)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)((long)dphi->fElem + lVar20 * 8 + lVar11 * lVar19) =
                 *(double *)
                  ((long)local_660.fElem +
                  lVar20 * 8 +
                  local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e90) *
                 *(double *)
                  ((long)(&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)
                             ((TPZManVector<int,_5> *)((long)local_d98.fElem + 0x38) + -1))->fPivot
                           + -1))->fPivot + 0xffffffffffffffff) + lVar25 * 8) +
                 local_c90.fElem[lVar15 + 6] *
                 *(double *)
                  ((long)(&((TPZFMatrix<double> *)
                           (&((TPZFMatrix<double> *)
                             ((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38) + -1))->fPivot
                           + -1))->fPivot + 0xffffffffffffffff) +
                  lVar20 * 8 + local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar16);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          local_ec0 = local_ec0 + 1;
          lVar25 = lVar25 + 1;
          lVar16 = lVar16 + 8;
          lVar19 = lVar19 + 8;
        } while (lVar25 != lVar22);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_e30);
      TPZFMatrix<double>::~TPZFMatrix(&local_d98);
      if (local_d00.super_TPZVec<long>.fStore != local_d00.fExtAlloc) {
        local_d00.super_TPZVec<long>.fNAlloc = 0;
        local_d00.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_d00.super_TPZVec<long>.fStore != (long *)0x0) {
          operator_delete__(local_d00.super_TPZVec<long>.fStore);
        }
      }
      local_e50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
      if (local_e50.fStore != (double *)0x0) {
        operator_delete__(local_e50.fStore);
      }
      lVar15 = lVar15 + 1;
      local_e90 = local_e90 + 8;
    } while (lVar15 != 9);
    paiVar21 = pztopology::TPZPrism::FaceNodes;
    local_e90 = 0x78;
    uVar14 = 0;
    do {
      if (((uVar14 & 3) != 0) || (order->fStore[uVar14 + 9] != 2)) {
        TPZVec<double>::TPZVec(&local_e50,2);
        ProjectPoint3dPrismaToFace((int)uVar14,pt,&local_e50);
        iVar8 = order->fStore[uVar14 + 9];
        if (((uVar14 & 3) != 0) || (2 < iVar8)) {
          if ((uVar14 & 3) == 0) {
            iVar24 = ((iVar8 + -1) * (iVar8 + -2)) / 2;
          }
          else {
            iVar24 = (iVar8 + -1) * (iVar8 + -1);
          }
          lVar15 = (long)iVar24;
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018151d8;
          local_d98.fElem = (double *)&local_2a8;
          local_d98.fSize = 0x14;
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar15;
          local_d98.fGiven = local_d98.fElem;
          TPZVec<int>::TPZVec(&local_d98.fPivot.super_TPZVec<int>,0);
          local_d98.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_d98.fPivot.super_TPZVec<int>.fStore = local_d98.fPivot.fExtAlloc;
          local_d98.fPivot.super_TPZVec<int>.fNElements = 0;
          local_d98.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_d98.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_d98.fWork.fStore = (double *)0x0;
          local_d98.fWork.fNElements = 0;
          local_d98.fWork.fNAlloc = 0;
          if (iVar24 == 0) {
            local_d98.fElem = (double *)0x0;
          }
          else if (0x14 < iVar24) {
            local_d98.fElem = (double *)operator_new__(lVar15 * 8);
          }
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
               (_func_int **)&PTR__TPZFMatrix_018151d8;
          local_e30.fElem = (double *)&local_8d8;
          local_e30.fSize = 0x3c;
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar15;
          local_e30.fGiven = local_e30.fElem;
          TPZVec<int>::TPZVec(&local_e30.fPivot.super_TPZVec<int>,0);
          local_e30.fPivot.super_TPZVec<int>._vptr_TPZVec =
               (_func_int **)&PTR__TPZManVector_01815498;
          local_e30.fPivot.super_TPZVec<int>.fStore = local_e30.fPivot.fExtAlloc;
          local_e30.fPivot.super_TPZVec<int>.fNElements = 0;
          local_e30.fPivot.super_TPZVec<int>.fNAlloc = 0;
          local_e30.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
          local_e30.fWork.fStore = (double *)0x0;
          local_e30.fWork.fNElements = 0;
          local_e30.fWork.fNAlloc = 0;
          if (iVar24 == 0) {
            local_e30.fElem = (double *)0x0;
          }
          else if (0x14 < iVar24) {
            local_e30.fElem = (double *)operator_new__(lVar15 * 0x18);
          }
          memset(local_d98.fElem,0,
                 local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          memset(local_e30.fElem,0,
                 local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
                 local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
          local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
               local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
          TPZManVector<long,_10>::TPZManVector(&local_d00,4);
          plVar10 = local_da0->fStore;
          lVar22 = 0;
          if ((uVar14 & 3) == 0) {
            do {
              local_d00.super_TPZVec<long>.fStore[lVar22] = plVar10[(*paiVar21)[lVar22]];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 3);
          }
          else {
            do {
              local_d00.super_TPZVec<long>.fStore[lVar22] = plVar10[(*paiVar21)[lVar22]];
              lVar22 = lVar22 + 1;
            } while (lVar22 != 4);
          }
          if ((uVar14 & 3) == 0) {
            TPZManVector<long,_10>::Resize(&local_d00,3);
            iVar13 = TPZShapeTriang::GetTransformId2dT(&local_d00.super_TPZVec<long>);
            *local_e50.fStore = (*local_e50.fStore + 1.0) * 0.5;
            local_e50.fStore[1] = (local_e50.fStore[1] + 1.0) * 0.5;
            TPZShapeTriang::ShapeInternal(&local_e50,iVar8 + -2,&local_d98,&local_e30,iVar13);
            if (0 < (int)(uint)local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol) {
              uVar23 = 0;
              do {
                if ((local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
                   (local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar23)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar22 = local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar23;
                *(double *)
                 ((long)(&((TPZFMatrix<double> *)
                          (&((TPZFMatrix<double> *)
                            ((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38) + -1))->fPivot +
                          -1))->fPivot + 0xffffffffffffffff) + lVar22 * 8) =
                     *(double *)
                      ((long)(&((TPZFMatrix<double> *)
                               (&((TPZFMatrix<double> *)
                                 ((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38) + -1))->
                                 fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar22 * 8) * 0.5;
                if ((local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 2) ||
                   (local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar23)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 (((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38))->fExtAlloc +
                 lVar22 * 2 + -0x14) =
                     *(double *)
                      (((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38))->fExtAlloc +
                      lVar22 * 2 + -0x14) * 0.5;
                uVar23 = uVar23 + 1;
              } while (((uint)local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol &
                       0x7fffffff) != uVar23);
            }
          }
          else {
            iVar13 = TPZShapeQuad::GetTransformId2dQ(&local_d00.super_TPZVec<long>);
            TPZShapeQuad::ShapeInternal(&local_e50,iVar8 + -2,&local_d98,&local_e30,iVar13);
          }
          TransformDerivativeFromFaceToPrisma((int)uVar14,iVar24,&local_e30);
          if (0 < iVar24) {
            lVar22 = uVar14 + 0xf;
            local_ec0 = (long)(int)local_ec0;
            lVar18 = local_ec0 * 8;
            lVar19 = 0;
            lVar16 = 0;
            do {
              if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                 (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
                 (local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_ec0 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ec0)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_ec0] =
                   local_c90.fElem[uVar14 + 0xf] *
                   *(double *)
                    ((long)(&((TPZFMatrix<double> *)
                             (&((TPZFMatrix<double> *)
                               ((TPZManVector<int,_5> *)((long)local_d98.fElem + 0x38) + -1))->
                               fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar16 * 8);
              lVar25 = 0;
              do {
                if ((local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar25) ||
                   (local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar22)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
                   (local_d98.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
                   (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar25) ||
                   (local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar16)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                lVar20 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
                if (((lVar20 <= lVar25) || (local_ec0 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ec0)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)((long)dphi->fElem + lVar25 * 8 + lVar20 * lVar18) =
                     *(double *)
                      ((long)local_660.fElem +
                      lVar25 * 8 +
                      local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e90) *
                     *(double *)
                      ((long)(&((TPZFMatrix<double> *)
                               (&((TPZFMatrix<double> *)
                                 ((TPZManVector<int,_5> *)((long)local_d98.fElem + 0x38) + -1))->
                                 fPivot + -1))->fPivot + 0xffffffffffffffff) + lVar16 * 8) +
                     local_c90.fElem[uVar14 + 0xf] *
                     *(double *)
                      ((long)(&((TPZFMatrix<double> *)
                               (&((TPZFMatrix<double> *)
                                 ((TPZManVector<int,_5> *)((long)local_e30.fElem + 0x38) + -1))->
                                 fPivot + -1))->fPivot + 0xffffffffffffffff) +
                      lVar25 * 8 +
                      local_e30.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar19);
                lVar25 = lVar25 + 1;
              } while (lVar25 != 3);
              local_ec0 = local_ec0 + 1;
              lVar16 = lVar16 + 1;
              lVar19 = lVar19 + 8;
              lVar18 = lVar18 + 8;
            } while (lVar16 != lVar15);
          }
          TPZManVector<long,_10>::~TPZManVector(&local_d00);
          TPZFMatrix<double>::~TPZFMatrix(&local_e30);
          TPZFMatrix<double>::~TPZFMatrix(&local_d98);
        }
        local_e50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (local_e50.fStore != (double *)0x0) {
          operator_delete__(local_e50.fStore);
        }
      }
      uVar14 = uVar14 + 1;
      paiVar21 = paiVar21 + 1;
      local_e90 = local_e90 + 8;
    } while (uVar14 != 5);
    iVar8 = order->fStore[0xe];
    if (2 < iVar8) {
      uVar17 = (iVar8 + -2) * (iVar8 + -1) * (iVar8 + -1);
      uVar14 = (ulong)(uVar17 >> 1);
      local_8d8.fElem = local_848;
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018175b8;
      local_8d8.fSize = 0x3c;
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar14;
      local_8d8.fGiven = local_8d8.fElem;
      TPZVec<int>::TPZVec(&local_8d8.fPivot.super_TPZVec<int>,0);
      local_8d8.fPivot.super_TPZVec<int>.fStore = local_8d8.fPivot.fExtAlloc;
      local_8d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_8d8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_8d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_8d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_8d8.fWork.fStore = (double *)0x0;
      local_8d8.fWork.fNElements = 0;
      local_8d8.fWork.fNAlloc = 0;
      if (0x79 < uVar17) {
        local_8d8.fElem = (double *)operator_new__(uVar14 * 8);
      }
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018172c8;
      local_2a8.fElem = local_218;
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018175b8;
      local_2a8.fSize = 0x3c;
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar14;
      local_2a8.fGiven = local_2a8.fElem;
      TPZVec<int>::TPZVec(&local_2a8.fPivot.super_TPZVec<int>,0);
      local_2a8.fPivot.super_TPZVec<int>.fStore = local_2a8.fPivot.fExtAlloc;
      local_2a8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
      local_2a8.fPivot.super_TPZVec<int>.fNElements = 0;
      local_2a8.fPivot.super_TPZVec<int>.fNAlloc = 0;
      local_2a8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      local_2a8.fWork.fStore = (double *)0x0;
      local_2a8.fWork.fNElements = 0;
      local_2a8.fWork.fNAlloc = 0;
      if (0x29 < uVar17) {
        local_2a8.fElem = (double *)operator_new__(uVar14 * 0x18);
      }
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018172c8;
      memset(local_8d8.fElem,0,
             local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      memset(local_2a8.fElem,0,
             local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
             local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
      local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
           local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
      ShapeInternal(pt,order->fStore[0xe],&local_8d8,&local_2a8);
      if (1 < uVar17) {
        local_ec8 = (long)(int)local_ec0;
        uVar23 = 1;
        if (1 < uVar17 >> 1) {
          uVar23 = uVar14;
        }
        local_ec0 = local_ec8 * 8;
        lVar15 = 0;
        uVar14 = 0;
        do {
          if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x15) ||
             (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
             (local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_ec8 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ec8)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_ec8] = local_c90.fElem[0x14] * local_8d8.fElem[uVar14];
          lVar22 = 0;
          do {
            if ((local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0x15)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar14) ||
               (local_8d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x15) ||
               (local_c90.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar22) ||
               (local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar14)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar18 = (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if (((lVar18 <= lVar22) || (local_ec8 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ec8)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)((long)dphi->fElem + lVar22 * 8 + lVar18 * local_ec0) =
                 local_660.fElem
                 [local_660.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0x14 + lVar22] *
                 local_8d8.fElem[uVar14] +
                 local_c90.fElem[0x14] *
                 *(double *)
                  ((long)local_2a8.fElem +
                  lVar22 * 8 + local_2a8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar15);
            lVar22 = lVar22 + 1;
          } while (lVar22 != 3);
          local_ec8 = local_ec8 + 1;
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 8;
          local_ec0 = local_ec0 + 8;
        } while (uVar14 != uVar23);
      }
      TPZFMatrix<double>::~TPZFMatrix(&local_2a8,&PTR_PTR_01817580);
      TPZFMatrix<double>::~TPZFMatrix(&local_8d8,&PTR_PTR_01817580);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_660,&PTR_PTR_018379a8);
    TPZFMatrix<double>::~TPZFMatrix(&local_c90,&PTR_PTR_018379a8);
  }
  return;
}

Assistant:

void TPZShapePrism::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
		for(is=NCornerNodes; is<NSides; is++) if(order[is-NCornerNodes] > 1) linear = false;
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[14]<2) return;//order tem as ordens dos lados do elemento
		int shape = 6;
		//rib shapes
		for (int rib = 0; rib < 9; rib++) {//todas as arestas
			REAL outval;
			ProjectPoint3dPrismaToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPrisma(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+6,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+6)  * phin( i, 0) +
					phiblend(rib+6, 0 )   * dphin(xj,i);
				}
				shape++;
			}
		}
		//  if(order[14]<2) return;//ordem do elemento
		//face shapes
		for (int face = 0; face < 5; face++) {
			
			if((face==0 || face==4) && order[face+9]==2) continue;//estas face nao tem shapes associadas com ordem p=2
			TPZVec<REAL> outval(2);
			ProjectPoint3dPrismaToFace(face,pt,outval);
			REAL store1[20],store2[60];
			int ord1;//,ord2;
			ord1 = order[face+9];
			//ord2 = ord1;
			//elpr->FaceOrder(face,ord1,ord2);//ordem da face
			if((face==0 || face==4) && ord1<3) continue;//uma face triangular com ordem < 3 n�o tem shape associada
			int ordin;
			if(face && face<4) ordin = (ord1-1)*(ord1-1);//faces quadrilaterais
			else ordin = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFMatrix<REAL> phin(ordin,1,store1,20),dphin(3,ordin,store2,60);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2
			int i;
			if(face ==0 || face == 4) for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			//    id0 = ShapeFaceId[face][0];//indice das shapes da face x
			//    id1 = ShapeFaceId[face][1];//que compoem a shape atual
			//    id2 = ShapeFaceId[face][2];
			int transid;
			if(face && face<4) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					//dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPrisma(face,ordin,dphin);//ordin = numero de shapes
			for(i=0;i<ordin;i++)	{
				phi(shape,0) = phiblend(face+15,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+15) * phin(i ,0) +
					phiblend(face+15, 0) * dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[14]<3) return;
		//volume shapes
		int ord=0;
		ord = NConnectShapeF(20,order[20-NCornerNodes]);
		TPZFNMatrix<60> phin(ord,1),dphin(3,ord);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[14],phin,dphin);
		for(int i=0;i<ord;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1)* phin(i ,0) +
				phiblend(NSides-1, 0)* dphin(xj,i);
			}
			shape++;
		}
		
		//}//while
		
	}